

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::pixelStorei(ReferenceContext *this,deUint32 pname,int param)

{
  deBool dVar1;
  int param_local;
  deUint32 pname_local;
  ReferenceContext *this_local;
  
  if (pname == 0xcf2) {
    do {
      if (param < 0) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelUnpackRowLength = param;
  }
  else if (pname == 0xcf3) {
    do {
      if (param < 0) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelUnpackSkipRows = param;
  }
  else if (pname == 0xcf4) {
    do {
      if (param < 0) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelUnpackSkipPixels = param;
  }
  else if (pname == 0xcf5) {
    do {
      if ((((param != 1) && (param != 2)) && (param != 4)) && (param != 8)) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelUnpackAlignment = param;
  }
  else if (pname == 0xd05) {
    do {
      if (((param != 1) && (param != 2)) && ((param != 4 && (param != 8)))) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelPackAlignment = param;
  }
  else if (pname == 0x806d) {
    do {
      if (param < 0) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelUnpackSkipImages = param;
  }
  else if (pname == 0x806e) {
    do {
      if (param < 0) {
        setError(this,0x501);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    this->m_pixelUnpackImageHeight = param;
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::pixelStorei (deUint32 pname, int param)
{
	switch (pname)
	{
		case GL_UNPACK_ALIGNMENT:
			RC_IF_ERROR(param != 1 && param != 2 && param != 4 && param != 8, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackAlignment = param;
			break;

		case GL_PACK_ALIGNMENT:
			RC_IF_ERROR(param != 1 && param != 2 && param != 4 && param != 8, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelPackAlignment = param;
			break;

		case GL_UNPACK_ROW_LENGTH:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackRowLength = param;
			break;

		case GL_UNPACK_SKIP_ROWS:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackSkipRows = param;
			break;

		case GL_UNPACK_SKIP_PIXELS:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackSkipPixels = param;
			break;

		case GL_UNPACK_IMAGE_HEIGHT:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackImageHeight = param;
			break;

		case GL_UNPACK_SKIP_IMAGES:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackSkipImages = param;
			break;

		default:
			setError(GL_INVALID_ENUM);
	}
}